

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O0

uchar encodeRegister(x86XmmReg dst,char spareField)

{
  uchar RM;
  uchar spare;
  uchar mod;
  char spareField_local;
  x86XmmReg dst_local;
  
  if (7 < (byte)spareField) {
    __assert_fail("unsigned(spareField) <= 0x7",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                  ,0x2f,"unsigned char encodeRegister(x86XmmReg, char)");
  }
  if (dst < rXMM8) {
    return spareField << 3 | 0xc0U | (byte)dst;
  }
  __assert_fail("unsigned(dst) <= 0x7",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                ,0x30,"unsigned char encodeRegister(x86XmmReg, char)");
}

Assistant:

unsigned char encodeRegister(x86XmmReg dst, char spareField)
{
	assert(unsigned(spareField) <= 0x7);
	assert(unsigned(dst) <= 0x7);

	unsigned char mod = 3 << 6;
	unsigned char spare = spareField << 3;
	unsigned char RM = (unsigned char)dst;
	return mod | spare | RM;
}